

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O0

bool __thiscall
iDynTree::ModelExporter::exportModelToFile(ModelExporter *this,string *filename,string *filetype)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer this_00;
  string *in_RDX;
  ModelExporterOptions *in_stack_00000038;
  string *in_stack_00000040;
  Model *in_stack_00000048;
  stringstream error_msg;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  ModelExporterOptions *in_stack_fffffffffffffda0;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [407];
  byte local_1;
  
  bVar1 = std::operator!=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Filetype ");
    poVar2 = std::operator<<(poVar2,in_RDX);
    std::operator<<(poVar2," not supported. Only urdf format is currently supported.");
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("ModelExporter","exportModelToFile",pcVar3);
    std::__cxx11::string::~string(local_1d8);
    local_1 = 0;
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    this_00 = std::
              unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
              ::operator->((unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
                            *)0x18b87a);
    std::
    unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
    ::operator->((unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
                  *)0x18b896);
    ModelExporterOptions::ModelExporterOptions
              (in_stack_fffffffffffffda0,
               (ModelExporterOptions *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98)
              );
    local_1 = URDFFromModel(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    ModelExporterOptions::~ModelExporterOptions((ModelExporterOptions *)this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ModelExporter::exportModelToFile(const std::string & filename, const std::string filetype)
{
    if (filetype != "urdf") {
        std::stringstream error_msg;
        error_msg << "Filetype " << filetype << " not supported. Only urdf format is currently supported.";
        reportError("ModelExporter", "exportModelToFile", error_msg.str().c_str());
        return false;
    }

    return URDFFromModel(m_pimpl->m_model, filename, m_pimpl->m_options);
}